

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncSatToSI64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  float fVar3;
  double dVar4;
  long lVar5;
  Literal local_50;
  Literal local_38;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal(&local_50,this);
    castToI64(&local_38,&local_50);
    dVar4 = (double)geti64(&local_38);
    local_20 = dVar4;
    if (NAN(dVar4)) goto LAB_00c95530;
    bVar2 = isInRangeI64TruncS((int64_t)dVar4);
    if (bVar2) {
      dVar4 = ::trunc(local_20);
      lVar5 = (long)dVar4;
      goto LAB_00c95507;
    }
    bVar2 = (long)dVar4 < 0;
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x396);
    }
    Literal(&local_50,this);
    castToI32(&local_38,&local_50);
    fVar3 = (float)geti32(&local_38);
    local_20 = (double)CONCAT44(local_20._4_4_,fVar3);
    if (NAN(fVar3)) {
LAB_00c95530:
      lVar5 = 0;
      goto LAB_00c95507;
    }
    bVar2 = isInRangeI64TruncS((int32_t)fVar3);
    if (bVar2) {
      fVar3 = truncf(local_20._0_4_);
      lVar5 = (long)fVar3;
      goto LAB_00c95507;
    }
    bVar2 = (int)fVar3 < 0;
  }
  lVar5 = -0x8000000000000000;
  if (!bVar2) {
    lVar5 = 0x7fffffffffffffff;
  }
LAB_00c95507:
  (__return_storage_ptr__->field_0).i64 = lVar5;
  (__return_storage_ptr__->type).id = 3;
  ~Literal(&local_38);
  ~Literal(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToSI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, int64_t, isInRangeI64TruncS>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, int64_t, isInRangeI64TruncS>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}